

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
::push_back(ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item)

{
  reserve(this,this->numActive + 1);
  std::__cxx11::string::string((string *)(this->items + this->numActive),(string *)item);
  this->numActive = this->numActive + 1;
  return;
}

Assistant:

void push_back (Item&& item)                            { reserve (numActive + 1); new (items + numActive) Item (std::move (item)); ++numActive; }